

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::augment(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
          *this)

{
  pointer pIVar1;
  pointer piVar2;
  IndexPair *idx;
  pointer pIVar3;
  pair<bool,_unsigned_long> pVar4;
  
  pIVar1 = (this->path_).
           super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar3 = (this->path_).
                super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar1; pIVar3 = pIVar3 + 1) {
    pVar4 = andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                      (this->graph_,pIVar3->row,pIVar3->col);
    piVar2 = (this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[pVar4.second] = (uint)(piVar2[pVar4.second] != 1);
  }
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::augment()
{
    for (auto const& idx : path_) {
        auto const& edge = graph_.findEdge(idx.row, idx.col).second;
        if (mask_[edge] == STARRED)
            mask_[edge] = 0;
        else
            mask_[edge] = STARRED;
    }
}